

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model_enumerators.cpp
# Opt level: O1

void __thiscall
Clasp::ModelEnumerator::BacktrackFinder::reason(BacktrackFinder *this,Solver *s,Literal p,LitVec *x)

{
  uint uVar1;
  ulong uVar2;
  Literal local_2c;
  
  uVar1 = *(uint *)((long)(s->assign_).assign_.ebo_.buf + (ulong)(p.rep_ & 0xfffffffc));
  if (0xf < uVar1) {
    uVar2 = 0;
    do {
      local_2c.rep_ =
           *(uint32 *)
            ((long)&((s->assign_).trail.ebo_.buf)->rep_ +
            (ulong)(uint)(*(int *)(&((s->levels_).super_type.ebo_.buf)->field_0x0 + uVar2) << 2));
      bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::push_back(x,&local_2c);
      uVar2 = uVar2 + 0x10;
    } while ((uVar1 & 0xfffffff0) != uVar2);
  }
  return;
}

Assistant:

void        reason(Solver& s, Literal p, LitVec& x){
		for (uint32 i = 1, end = s.level(p.var()); i <= end; ++i) {
			x.push_back(s.decision(i));
		}
	}